

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O3

void __thiscall
jrtplib::RTCPScheduler::RTCPScheduler(RTCPScheduler *this,RTPSources *s,RTPRandom *r)

{
  this->sources = s;
  (this->schedparams).mininterval.m_t = 5.0;
  (this->schedparams).bandwidth = 1000.0;
  (this->schedparams).senderfraction = 0.25;
  (this->schedparams).usehalfatstartup = true;
  (this->schedparams).immediatebye = true;
  timeinit = timeinit + 1;
  (this->nextrtcptime).m_t = 0.0;
  (this->prevrtcptime).m_t = 0.0;
  this->rtprand = r;
  this->headeroverhead = 0;
  this->hassentrtcp = false;
  this->firstcall = true;
  this->avgrtcppacksize = 1000;
  this->byescheduled = false;
  this->sendbyenow = false;
  return;
}

Assistant:

RTCPScheduler::RTCPScheduler(RTPSources &s, RTPRandom &r) : sources(s),nextrtcptime(0,0),prevrtcptime(0,0),rtprand(r)
{
	Reset();

	//std::cout << (void *)(&rtprand) << std::endl;
}